

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

bool __thiscall
cmOrderDirectoriesConstraintSOName::FindConflict
          (cmOrderDirectoriesConstraintSOName *this,string *dir)

{
  _Rb_tree_header *__y;
  pointer pcVar1;
  bool bVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_iterator cVar3;
  const_iterator cVar4;
  string base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((this->SOName)._M_string_length == 0) {
    this_00 = &cmGlobalGenerator::GetDirectoryContent
                         ((this->super_cmOrderDirectoriesConstraint).GlobalGenerator,dir,true)->_M_t
    ;
    pcVar1 = (this->super_cmOrderDirectoriesConstraint).FileName._M_dataplus._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,
               pcVar1 + (this->super_cmOrderDirectoriesConstraint).FileName._M_string_length);
    __y = &(this_00->_M_impl).super__Rb_tree_header;
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_lower_bound(this_00,(_Const_Link_type)
                                     (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent,
                             &__y->_M_header,&local_40);
    local_40._M_dataplus._M_p[local_40._M_string_length - 1] =
         local_40._M_dataplus._M_p[local_40._M_string_length - 1] + '\x01';
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_upper_bound(this_00,(_Const_Link_type)
                                     (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent,
                             &__y->_M_header,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (cVar3._M_node != cVar4._M_node) {
      return true;
    }
  }
  else {
    bVar2 = cmOrderDirectoriesConstraint::FileMayConflict
                      (&this->super_cmOrderDirectoriesConstraint,dir,&this->SOName);
    if (bVar2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool cmOrderDirectoriesConstraintSOName::FindConflict(std::string const& dir)
{
  // Determine which type of check to do.
  if (!this->SOName.empty()) {
    // We have the library soname.  Check if it will be found.
    if (this->FileMayConflict(dir, this->SOName)) {
      return true;
    }
  } else {
    // We do not have the soname.  Look for files in the directory
    // that may conflict.
    std::set<std::string> const& files =
      (this->GlobalGenerator->GetDirectoryContent(dir, true));

    // Get the set of files that might conflict.  Since we do not
    // know the soname just look at all files that start with the
    // file name.  Usually the soname starts with the library name.
    std::string base = this->FileName;
    auto first = files.lower_bound(base);
    ++base.back();
    auto last = files.upper_bound(base);
    if (first != last) {
      return true;
    }
  }
  return false;
}